

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O1

char * resolve_runtime_path(char *prefix)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *dest;
  
  __s = require_environment("APPDIR");
  sVar1 = strlen(__s);
  sVar2 = strlen(prefix);
  sVar1 = (size_t)((int)sVar2 + (int)sVar1 + 2);
  dest = (char *)calloc(sVar1,1);
  memset(dest,0,sVar1);
  apprun_concat_path(dest,__s);
  apprun_concat_path(dest,prefix);
  return dest;
}

Assistant:

char *resolve_runtime_path(const char *prefix) {
    char *appdir = require_environment("APPDIR");
    int appdir_len = strlen(appdir);
    int runtime_prefix_len = strlen(prefix);
    int extra_slash_len = 1;

    int path_len = appdir_len + extra_slash_len + runtime_prefix_len + 1;
    char *path = calloc(path_len, sizeof(char));
    memset(path, 0, path_len);

    apprun_concat_path(path, appdir);
    apprun_concat_path(path, prefix);

    return path;
}